

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O2

bool embree::sse2::FlatLinearCurveMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  Vector *pVVar17;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  Scene *pSVar23;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  int iVar33;
  uint uVar34;
  RTCFilterFunctionN p_Var35;
  RTCRayN *pRVar36;
  long lVar37;
  ulong uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar44;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar45;
  float fVar46;
  float fVar54;
  float fVar56;
  float fVar58;
  undefined1 auVar48 [16];
  float fVar47;
  float fVar55;
  float fVar57;
  float fVar59;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  Precalculations *local_1c0;
  RTCFilterFunctionNArguments args;
  uint local_138 [4];
  LineIntersectorHitM<4> hit;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar23 = context->scene;
  uVar34 = line->sharedGeomID;
  uVar19 = (line->v0).field_0.i[0];
  pGVar24 = (pSVar23->geometries).items[uVar34].ptr;
  fVar45 = pGVar24->fnumTimeSegments;
  fVar40 = (pGVar24->time_range).lower;
  fVar39 = ((*(float *)(ray + k * 4 + 0x70) - fVar40) / ((pGVar24->time_range).upper - fVar40)) *
           fVar45;
  local_1c0 = pre;
  fVar40 = floorf(fVar39);
  fVar45 = fVar45 + -1.0;
  if (fVar45 <= fVar40) {
    fVar40 = fVar45;
  }
  fVar45 = 0.0;
  if (0.0 <= fVar40) {
    fVar45 = fVar40;
  }
  lVar25 = *(long *)&pGVar24[3].time_range.upper;
  lVar37 = (long)(int)fVar45 * 0x38;
  lVar26 = *(long *)(lVar25 + lVar37);
  lVar27 = *(long *)(lVar25 + 0x10 + lVar37);
  pfVar1 = (float *)(lVar26 + lVar27 * (ulong)uVar19);
  uVar20 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar26 + lVar27 * (ulong)uVar20);
  uVar21 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar26 + lVar27 * (ulong)uVar21);
  uVar22 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar26 + lVar27 * (ulong)uVar22);
  lVar5 = lVar26 + lVar27 * (ulong)(uVar19 + 1);
  lVar6 = lVar26 + lVar27 * (ulong)(uVar20 + 1);
  puVar7 = (undefined4 *)(lVar26 + lVar27 * (ulong)(uVar21 + 1));
  uStack_1c8 = *puVar7;
  puVar8 = (undefined4 *)(lVar26 + lVar27 * (ulong)(uVar22 + 1));
  uStack_1c4 = *puVar8;
  lVar26 = *(long *)(lVar25 + 0x38 + lVar37);
  lVar25 = *(long *)(lVar25 + 0x48 + lVar37);
  pfVar9 = (float *)(lVar26 + (ulong)uVar19 * lVar25);
  pfVar10 = (float *)(lVar26 + (ulong)uVar20 * lVar25);
  pfVar11 = (float *)(lVar26 + (ulong)uVar21 * lVar25);
  pfVar12 = (float *)(lVar26 + (ulong)uVar22 * lVar25);
  pfVar13 = (float *)(lVar26 + (ulong)(uVar19 + 1) * lVar25);
  pfVar14 = (float *)(lVar26 + (ulong)(uVar21 + 1) * lVar25);
  fVar39 = fVar39 - fVar45;
  pfVar15 = (float *)(lVar26 + (ulong)(uVar20 + 1) * lVar25);
  pfVar16 = (float *)(lVar26 + lVar25 * (ulong)(uVar22 + 1));
  fVar73 = 1.0 - fVar39;
  fVar98 = *pfVar1 * fVar73 + *pfVar9 * fVar39;
  fVar101 = *pfVar2 * fVar73 + *pfVar10 * fVar39;
  fVar104 = *pfVar3 * fVar73 + *pfVar11 * fVar39;
  fVar107 = *pfVar4 * fVar73 + *pfVar12 * fVar39;
  fVar92 = pfVar1[1] * fVar73 + pfVar9[1] * fVar39;
  fVar95 = pfVar2[1] * fVar73 + pfVar10[1] * fVar39;
  fVar96 = pfVar3[1] * fVar73 + pfVar11[1] * fVar39;
  fVar97 = pfVar4[1] * fVar73 + pfVar12[1] * fVar39;
  fVar74 = pfVar1[2] * fVar73 + pfVar9[2] * fVar39;
  fVar76 = pfVar2[2] * fVar73 + pfVar10[2] * fVar39;
  fVar78 = pfVar3[2] * fVar73 + pfVar11[2] * fVar39;
  fVar80 = pfVar4[2] * fVar73 + pfVar12[2] * fVar39;
  fVar110 = pfVar1[3] * fVar73 + pfVar9[3] * fVar39;
  fVar111 = pfVar2[3] * fVar73 + pfVar10[3] * fVar39;
  fVar112 = pfVar3[3] * fVar73 + pfVar11[3] * fVar39;
  fVar113 = pfVar4[3] * fVar73 + pfVar12[3] * fVar39;
  fVar63 = (float)puVar7[2] * fVar73 + *pfVar13 * fVar39;
  fVar64 = (float)puVar8[2] * fVar73 + *pfVar15 * fVar39;
  fStack_1d0 = fStack_1d0 * fVar73 + *pfVar14 * fVar39;
  fStack_1cc = fStack_1cc * fVar73 + *pfVar16 * fVar39;
  _local_1d8 = CONCAT44(fVar64,fVar63);
  fVar46 = *(float *)(lVar5 + 4) * fVar73 + pfVar13[1] * fVar39;
  fVar54 = *(float *)(lVar6 + 4) * fVar73 + pfVar15[1] * fVar39;
  fVar56 = (float)puVar7[1] * fVar73 + pfVar14[1] * fVar39;
  fVar58 = (float)puVar8[1] * fVar73 + pfVar16[1] * fVar39;
  fVar41 = *(float *)(lVar5 + 8) * fVar73 + pfVar13[2] * fVar39;
  fVar44 = *(float *)(lVar6 + 8) * fVar73 + pfVar15[2] * fVar39;
  fStack_1e0 = fStack_1e0 * fVar73 + pfVar14[2] * fVar39;
  fStack_1dc = fStack_1dc * fVar73 + pfVar16[2] * fVar39;
  _local_1e8 = CONCAT44(fVar44,fVar41);
  local_138[0] = uVar34;
  local_138[1] = uVar34;
  local_138[2] = uVar34;
  local_138[3] = uVar34;
  pVVar17 = &local_1c0->ray_space[k].vy;
  fVar47 = (pVVar17->field_0).m128[0];
  fVar55 = (pVVar17->field_0).m128[1];
  fVar30 = (pVVar17->field_0).m128[2];
  pVVar17 = &local_1c0->ray_space[k].vz;
  fVar57 = (pVVar17->field_0).m128[0];
  fVar59 = (pVVar17->field_0).m128[1];
  fVar31 = (pVVar17->field_0).m128[2];
  fVar45 = *(float *)(ray + k * 4 + 0x10);
  fVar40 = *(float *)(ray + k * 4 + 0x20);
  fVar82 = fVar92 - fVar45;
  fVar83 = fVar95 - fVar45;
  fVar84 = fVar96 - fVar45;
  fVar85 = fVar97 - fVar45;
  fVar75 = fVar74 - fVar40;
  fVar77 = fVar76 - fVar40;
  fVar79 = fVar78 - fVar40;
  fVar81 = fVar80 - fVar40;
  pVVar17 = &local_1c0->ray_space[k].vx;
  fVar87 = (pVVar17->field_0).m128[0];
  fVar91 = *(float *)((long)&pVVar17->field_0 + 4);
  fVar32 = *(float *)((long)&pVVar17->field_0 + 8);
  fVar86 = *(float *)(ray + k * 4);
  fVar99 = fVar98 - fVar86;
  fVar102 = fVar101 - fVar86;
  fVar105 = fVar104 - fVar86;
  fVar108 = fVar107 - fVar86;
  fVar65 = fVar87 * fVar99 + fVar47 * fVar82 + fVar57 * fVar75;
  fVar66 = fVar87 * fVar102 + fVar47 * fVar83 + fVar57 * fVar77;
  fVar67 = fVar87 * fVar105 + fVar47 * fVar84 + fVar57 * fVar79;
  fVar68 = fVar87 * fVar108 + fVar47 * fVar85 + fVar57 * fVar81;
  fVar69 = fVar91 * fVar99 + fVar55 * fVar82 + fVar59 * fVar75;
  fVar70 = fVar91 * fVar102 + fVar55 * fVar83 + fVar59 * fVar77;
  fVar71 = fVar91 * fVar105 + fVar55 * fVar84 + fVar59 * fVar79;
  fVar72 = fVar91 * fVar108 + fVar55 * fVar85 + fVar59 * fVar81;
  fVar100 = fVar99 * fVar32 + fVar82 * fVar30 + fVar75 * fVar31;
  fVar103 = fVar102 * fVar32 + fVar83 * fVar30 + fVar77 * fVar31;
  fVar106 = fVar105 * fVar32 + fVar84 * fVar30 + fVar79 * fVar31;
  fVar109 = fVar108 * fVar32 + fVar85 * fVar30 + fVar81 * fVar31;
  fVar84 = fVar63 - fVar86;
  fVar85 = fVar64 - fVar86;
  fVar99 = fStack_1d0 - fVar86;
  fVar86 = fStack_1cc - fVar86;
  fVar75 = fVar46 - fVar45;
  fVar77 = fVar54 - fVar45;
  fVar79 = fVar56 - fVar45;
  fVar45 = fVar58 - fVar45;
  fVar81 = fVar41 - fVar40;
  fVar82 = fVar44 - fVar40;
  fVar83 = fStack_1e0 - fVar40;
  fVar40 = fStack_1dc - fVar40;
  fVar102 = (fVar87 * fVar84 + fVar47 * fVar75 + fVar57 * fVar81) - fVar65;
  fVar105 = (fVar87 * fVar85 + fVar47 * fVar77 + fVar57 * fVar82) - fVar66;
  fVar108 = (fVar87 * fVar99 + fVar47 * fVar79 + fVar57 * fVar83) - fVar67;
  fVar87 = (fVar87 * fVar86 + fVar47 * fVar45 + fVar57 * fVar40) - fVar68;
  fVar88 = (fVar91 * fVar84 + fVar55 * fVar75 + fVar59 * fVar81) - fVar69;
  fVar89 = (fVar91 * fVar85 + fVar55 * fVar77 + fVar59 * fVar82) - fVar70;
  fVar90 = (fVar91 * fVar99 + fVar55 * fVar79 + fVar59 * fVar83) - fVar71;
  fVar91 = (fVar91 * fVar86 + fVar55 * fVar45 + fVar59 * fVar40) - fVar72;
  auVar94._0_4_ = fVar88 * fVar88;
  auVar94._4_4_ = fVar89 * fVar89;
  auVar94._8_4_ = fVar90 * fVar90;
  auVar94._12_4_ = fVar91 * fVar91;
  auVar60._0_4_ = fVar102 * fVar102 + auVar94._0_4_;
  auVar60._4_4_ = fVar105 * fVar105 + auVar94._4_4_;
  auVar60._8_4_ = fVar108 * fVar108 + auVar94._8_4_;
  auVar60._12_4_ = fVar87 * fVar87 + auVar94._12_4_;
  auVar48 = rcpps(auVar94,auVar60);
  fVar47 = auVar48._0_4_;
  fVar55 = auVar48._4_4_;
  fVar57 = auVar48._8_4_;
  fVar59 = auVar48._12_4_;
  auVar93._0_4_ =
       (((float)DAT_01f46a60 - auVar60._0_4_ * fVar47) * fVar47 + fVar47) *
       (-fVar69 * fVar88 - fVar65 * fVar102);
  auVar93._4_4_ =
       ((DAT_01f46a60._4_4_ - auVar60._4_4_ * fVar55) * fVar55 + fVar55) *
       (-fVar70 * fVar89 - fVar66 * fVar105);
  auVar93._8_4_ =
       ((DAT_01f46a60._8_4_ - auVar60._8_4_ * fVar57) * fVar57 + fVar57) *
       (-fVar71 * fVar90 - fVar67 * fVar108);
  auVar93._12_4_ =
       ((DAT_01f46a60._12_4_ - auVar60._12_4_ * fVar59) * fVar59 + fVar59) *
       (-fVar72 * fVar91 - fVar68 * fVar87);
  auVar94 = minps(auVar93,_DAT_01f46a60);
  auVar48._0_12_ = ZEXT812(0);
  auVar48._12_4_ = 0;
  hit.vu.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar94,auVar48);
  fVar47 = hit.vu.field_0._0_4_;
  fVar55 = hit.vu.field_0._4_4_;
  fVar57 = hit.vu.field_0._8_4_;
  fVar59 = hit.vu.field_0._12_4_;
  fVar65 = fVar102 * fVar47 + fVar65;
  fVar66 = fVar105 * fVar55 + fVar66;
  fVar67 = fVar108 * fVar57 + fVar67;
  fVar68 = fVar87 * fVar59 + fVar68;
  fVar69 = fVar88 * fVar47 + fVar69;
  fVar70 = fVar89 * fVar55 + fVar70;
  fVar71 = fVar90 * fVar57 + fVar71;
  fVar72 = fVar91 * fVar59 + fVar72;
  hit.vt.field_0.v[0] =
       ((fVar84 * fVar32 + fVar75 * fVar30 + fVar81 * fVar31) - fVar100) * fVar47 + fVar100;
  hit.vt.field_0.v[1] =
       ((fVar85 * fVar32 + fVar77 * fVar30 + fVar82 * fVar31) - fVar103) * fVar55 + fVar103;
  hit.vt.field_0.v[2] =
       ((fVar99 * fVar32 + fVar79 * fVar30 + fVar83 * fVar31) - fVar106) * fVar57 + fVar106;
  hit.vt.field_0.v[3] =
       ((fVar86 * fVar32 + fVar45 * fVar30 + fVar40 * fVar31) - fVar109) * fVar59 + fVar109;
  fVar110 = ((fVar73 * *(float *)(lVar5 + 0xc) + fVar39 * pfVar13[3]) - fVar110) * fVar47 + fVar110;
  fVar111 = ((fVar73 * *(float *)(lVar6 + 0xc) + fVar39 * pfVar15[3]) - fVar111) * fVar55 + fVar111;
  fVar112 = ((fVar73 * (float)puVar7[3] + fVar39 * pfVar14[3]) - fVar112) * fVar57 + fVar112;
  fVar113 = ((fVar73 * (float)puVar8[3] + fVar39 * pfVar16[3]) - fVar113) * fVar59 + fVar113;
  fVar45 = *(float *)(ray + k * 4 + 0x80);
  fVar40 = *(float *)(ray + k * 4 + 0x30);
  fVar39 = *(float *)((long)local_1c0->ray_space + k * 4 + -0x10);
  auVar49._0_4_ =
       -(uint)((fVar110 + fVar110) * fVar39 < hit.vt.field_0.v[0]) &
       ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) &
       -(uint)(hit.vt.field_0.v[0] <= fVar45 && fVar40 <= hit.vt.field_0.v[0]) &
       -(uint)(fVar65 * fVar65 + fVar69 * fVar69 <= fVar110 * fVar110);
  auVar49._4_4_ =
       -(uint)((fVar111 + fVar111) * fVar39 < hit.vt.field_0.v[1]) &
       ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) &
       -(uint)(hit.vt.field_0.v[1] <= fVar45 && fVar40 <= hit.vt.field_0.v[1]) &
       -(uint)(fVar66 * fVar66 + fVar70 * fVar70 <= fVar111 * fVar111);
  auVar49._8_4_ =
       -(uint)((fVar112 + fVar112) * fVar39 < hit.vt.field_0.v[2]) &
       ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) &
       -(uint)(hit.vt.field_0.v[2] <= fVar45 && fVar40 <= hit.vt.field_0.v[2]) &
       -(uint)(fVar67 * fVar67 + fVar71 * fVar71 <= fVar112 * fVar112);
  auVar49._12_4_ =
       -(uint)((fVar113 + fVar113) * fVar39 < hit.vt.field_0.v[3]) &
       ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) &
       -(uint)(hit.vt.field_0.v[3] <= fVar45 && fVar40 <= hit.vt.field_0.v[3]) &
       -(uint)(fVar68 * fVar68 + fVar72 * fVar72 <= fVar113 * fVar113);
  iVar33 = movmskps((int)k * 0x30,auVar49);
  if (iVar33 != 0) {
    hit.vNg.field_0._0_4_ = fVar63 - fVar98;
    hit.vNg.field_0._4_4_ = fVar64 - fVar101;
    hit.vNg.field_0._8_4_ = fStack_1d0 - fVar104;
    hit.vNg.field_0._12_4_ = fStack_1cc - fVar107;
    hit.vNg.field_0._16_4_ = fVar46 - fVar92;
    hit.vNg.field_0._20_4_ = fVar54 - fVar95;
    hit.vNg.field_0._24_4_ = fVar56 - fVar96;
    hit.vNg.field_0._28_4_ = fVar58 - fVar97;
    hit.vNg.field_0._32_4_ = fVar41 - fVar74;
    hit.vNg.field_0._36_4_ = fVar44 - fVar76;
    hit.vNg.field_0._40_4_ = fStack_1e0 - fVar78;
    hit.vNg.field_0._44_4_ = fStack_1dc - fVar80;
    auVar61._4_4_ = -(uint)((float)hit.vNg.field_0._4_4_ != 0.0);
    auVar61._0_4_ = -(uint)((float)hit.vNg.field_0._0_4_ != 0.0);
    auVar61._8_4_ = -(uint)((float)hit.vNg.field_0._8_4_ != 0.0);
    auVar61._12_4_ = -(uint)((float)hit.vNg.field_0._12_4_ != 0.0);
    auVar62._4_4_ = -(uint)((float)hit.vNg.field_0._20_4_ != 0.0);
    auVar62._0_4_ = -(uint)((float)hit.vNg.field_0._16_4_ != 0.0);
    auVar62._8_4_ = -(uint)((float)hit.vNg.field_0._24_4_ != 0.0);
    auVar62._12_4_ = -(uint)((float)hit.vNg.field_0._28_4_ != 0.0);
    auVar42._4_4_ = -(uint)((float)hit.vNg.field_0._36_4_ != 0.0);
    auVar42._0_4_ = -(uint)((float)hit.vNg.field_0._32_4_ != 0.0);
    auVar42._8_4_ = -(uint)((float)hit.vNg.field_0._40_4_ != 0.0);
    auVar42._12_4_ = -(uint)((float)hit.vNg.field_0._44_4_ != 0.0);
    auVar42 = auVar42 | auVar62 | auVar61;
    auVar50._0_4_ = auVar49._0_4_ & auVar42._0_4_;
    auVar50._4_4_ = auVar49._4_4_ & auVar42._4_4_;
    auVar50._8_4_ = auVar49._8_4_ & auVar42._8_4_;
    auVar50._12_4_ = auVar49._12_4_ & auVar42._12_4_;
    uVar34 = movmskps(iVar33,auVar50);
    if (uVar34 != 0) {
      hit.vv.field_0._0_8_ = 0;
      hit.vv.field_0._8_8_ = 0;
      uVar38 = (ulong)(uVar34 & 0xff);
      auVar48 = _DAT_01f45a40;
      do {
        args.hit = (RTCHitN *)&local_c8;
        args.valid = (int *)local_1f8;
        uVar28 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        local_68 = local_138[uVar28];
        pGVar24 = (pSVar23->geometries).items[local_68].ptr;
        if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_98 = *(undefined4 *)((long)&hit.vu.field_0 + uVar28 * 4);
          uVar18 = *(undefined4 *)((long)&hit.vv.field_0 + uVar28 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)&hit.vt.field_0 + uVar28 * 4);
          args.context = context->user;
          local_78 = (line->primIDs).field_0.i[uVar28];
          local_88._4_4_ = uVar18;
          local_88._0_4_ = uVar18;
          local_88._8_4_ = uVar18;
          local_88._12_4_ = uVar18;
          local_c8 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar28 * 4);
          local_b8 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar28 * 4 + 0x10);
          local_a8 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar28 * 4 + 0x20);
          uStack_c4 = local_c8;
          uStack_c0 = local_c8;
          uStack_bc = local_c8;
          uStack_b4 = local_b8;
          uStack_b0 = local_b8;
          uStack_ac = local_b8;
          uStack_a4 = local_a8;
          uStack_a0 = local_a8;
          uStack_9c = local_a8;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = (args.context)->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = (args.context)->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          local_1f8 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          args.geometryUserPtr = pGVar24->userPtr;
          args.N = 4;
          p_Var35 = pGVar24->occlusionFilterN;
          args.ray = (RTCRayN *)ray;
          if (p_Var35 != (RTCFilterFunctionN)0x0) {
            p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&args);
            auVar48 = _DAT_01f45a40;
          }
          auVar51._0_4_ = -(uint)(local_1f8._0_4_ == 0);
          auVar51._4_4_ = -(uint)(local_1f8._4_4_ == 0);
          auVar51._8_4_ = -(uint)(local_1f8._8_4_ == 0);
          auVar51._12_4_ = -(uint)(local_1f8._12_4_ == 0);
          uVar34 = movmskps((int)p_Var35,auVar51);
          pRVar36 = (RTCRayN *)(ulong)(uVar34 ^ 0xf);
          if ((uVar34 ^ 0xf) == 0) {
            auVar29._8_4_ = 0xffffffff;
            auVar29._0_8_ = 0xffffffffffffffff;
            auVar29._12_4_ = 0xffffffff;
            auVar52 = auVar51 ^ auVar29;
          }
          else {
            p_Var35 = context->args->filter;
            if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var35)(&args);
              auVar48 = _DAT_01f45a40;
            }
            auVar43._0_4_ = -(uint)(local_1f8._0_4_ == 0);
            auVar43._4_4_ = -(uint)(local_1f8._4_4_ == 0);
            auVar43._8_4_ = -(uint)(local_1f8._8_4_ == 0);
            auVar43._12_4_ = -(uint)(local_1f8._12_4_ == 0);
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            auVar52 = auVar43 ^ auVar52;
            *(undefined1 (*) [16])(args.ray + 0x80) =
                 ~auVar43 & auVar48 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar43;
            pRVar36 = args.ray;
          }
          auVar53._0_4_ = auVar52._0_4_ << 0x1f;
          auVar53._4_4_ = auVar52._4_4_ << 0x1f;
          auVar53._8_4_ = auVar52._8_4_ << 0x1f;
          auVar53._12_4_ = auVar52._12_4_ << 0x1f;
          iVar33 = movmskps((int)pRVar36,auVar53);
          if (iVar33 != 0) {
            return true;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar45;
        }
        uVar38 = uVar38 ^ 1L << (uVar28 & 0x3f);
      } while (uVar38 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }